

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O3

lws_spa * lws_spa_create_via_info(lws *wsi,lws_spa_create_info_t *i)

{
  byte bVar1;
  lws_spa_fileupload_cb p_Var2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  lws_spa *spa;
  char *pcVar7;
  char **ppcVar8;
  lws_urldecode_stateful *plVar9;
  long lVar10;
  int *piVar11;
  char *pcVar12;
  size_t sVar13;
  lwsac **pplVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  
  if (i->ac == (lwsac **)0x0) {
    spa = (lws_spa *)lws_zalloc(0x68,"spa");
  }
  else {
    spa = (lws_spa *)lwsac_use_zero(i->ac,0x68,i->ac_chunk_size);
  }
  if (spa == (lws_spa *)0x0) {
    return (lws_spa *)0x0;
  }
  iVar5 = i->count_params;
  iVar4 = i->max_storage;
  p_Var2 = i->opt_cb;
  pvVar3 = i->opt_data;
  sVar13 = i->param_names_stride;
  pplVar14 = i->ac;
  (spa->i).param_names = i->param_names;
  (spa->i).count_params = iVar5;
  (spa->i).max_storage = iVar4;
  (spa->i).ac_chunk_size = i->ac_chunk_size;
  (spa->i).param_names_stride = sVar13;
  (spa->i).ac = pplVar14;
  (spa->i).opt_cb = p_Var2;
  (spa->i).opt_data = pvVar3;
  uVar6 = (spa->i).max_storage;
  if (uVar6 == 0) {
    (spa->i).max_storage = 0x200;
    uVar6 = 0x200;
  }
  if (i->ac == (lwsac **)0x0) {
    pcVar7 = (char *)lws_realloc((void *)0x0,(ulong)uVar6,"spa");
  }
  else {
    pcVar7 = (char *)lwsac_use(i->ac,(ulong)uVar6,i->ac_chunk_size);
  }
  spa->storage = pcVar7;
  if (pcVar7 != (char *)0x0) {
    iVar5 = i->max_storage;
    spa->end = pcVar7 + (long)iVar5 + -1;
    if ((ulong)(uint)i->count_params == 0) {
LAB_0013500d:
      pplVar14 = (spa->i).ac;
      if (pplVar14 == (lwsac **)0x0) {
        plVar9 = (lws_urldecode_stateful *)lws_zalloc(0x240,"stateful urldecode");
      }
      else {
        plVar9 = (lws_urldecode_stateful *)lwsac_use_zero(pplVar14,0x240,(spa->i).ac_chunk_size);
      }
      if (plVar9 == (lws_urldecode_stateful *)0x0) {
        spa->s = (lws_urldecode_stateful *)0x0;
      }
      else {
        plVar9->out = pcVar7;
        plVar9->out_len = iVar5;
        plVar9->output = lws_urldecode_spa_cb;
        plVar9->pos = 0;
        plVar9->mp = 0;
        plVar9->sum = 0;
        plVar9->state = US_NAME;
        plVar9->name[0] = '\0';
        plVar9->data = spa;
        plVar9->wsi = wsi;
        iVar5 = lws_hdr_copy(wsi,&local_108,0xcd,WSI_TOKEN_HTTP_CONTENT_TYPE);
        if ((0 < iVar5) &&
           ((auVar17[0] = -(cStack_105 == 't'), auVar17[1] = -(cStack_104 == 'i'),
            auVar17[2] = -(cStack_103 == 'p'), auVar17[3] = -(cStack_102 == 'a'),
            auVar17[4] = -(cStack_101 == 'r'), auVar17[5] = -(cStack_100 == 't'),
            auVar17[6] = -(cStack_ff == '/'), auVar17[7] = -(cStack_fe == 'f'),
            auVar17[8] = -(cStack_fd == 'o'), auVar17[9] = -(cStack_fc == 'r'),
            auVar17[10] = -(cStack_fb == 'm'), auVar17[0xb] = -(cStack_fa == '-'),
            auVar17[0xc] = -(cStack_f9 == 'd'), auVar17[0xd] = -(local_f8 == 'a'),
            auVar17[0xe] = -(cStack_f7 == 't'), auVar17[0xf] = -(cStack_f6 == 'a'),
            auVar15[0] = -(local_108 == 'm'), auVar15[1] = -(cStack_107 == 'u'),
            auVar15[2] = -(cStack_106 == 'l'), auVar15[3] = -(cStack_105 == 't'),
            auVar15[4] = -(cStack_104 == 'i'), auVar15[5] = -(cStack_103 == 'p'),
            auVar15[6] = -(cStack_102 == 'a'), auVar15[7] = -(cStack_101 == 'r'),
            auVar15[8] = -(cStack_100 == 't'), auVar15[9] = -(cStack_ff == '/'),
            auVar15[10] = -(cStack_fe == 'f'), auVar15[0xb] = -(cStack_fd == 'o'),
            auVar15[0xc] = -(cStack_fc == 'r'), auVar15[0xd] = -(cStack_fb == 'm'),
            auVar15[0xe] = -(cStack_fa == '-'), auVar15[0xf] = -(cStack_f9 == 'd'),
            auVar15 = auVar15 & auVar17,
            (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff ||
            (auVar16[0] = -(local_108 == 'm'), auVar16[1] = -(cStack_107 == 'u'),
            auVar16[2] = -(cStack_106 == 'l'), auVar16[3] = -(cStack_105 == 't'),
            auVar16[4] = -(cStack_104 == 'i'), auVar16[5] = -(cStack_103 == 'p'),
            auVar16[6] = -(cStack_102 == 'a'), auVar16[7] = -(cStack_101 == 'r'),
            auVar16[8] = -(cStack_100 == 't'), auVar16[9] = -(cStack_ff == '/'),
            auVar16[10] = -(cStack_fe == 'r'), auVar16[0xb] = -(cStack_fd == 'e'),
            auVar16[0xc] = -(cStack_fc == 'l'), auVar16[0xd] = -(cStack_fb == 'a'),
            auVar16[0xe] = -(cStack_fa == 't'), auVar16[0xf] = -(cStack_f9 == 'e'),
            auVar18[0] = -(local_f8 == 'd'), auVar18[1] = 0xff, auVar18[2] = 0xff, auVar18[3] = 0xff
            , auVar18[4] = 0xff, auVar18[5] = 0xff, auVar18[6] = 0xff, auVar18[7] = 0xff,
            auVar18[8] = 0xff, auVar18[9] = 0xff, auVar18[10] = 0xff, auVar18[0xb] = 0xff,
            auVar18[0xc] = 0xff, auVar18[0xd] = 0xff, auVar18[0xe] = 0xff, auVar18[0xf] = 0xff,
            auVar18 = auVar18 & auVar16,
            (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff)))) {
          plVar9->field_0x22d = plVar9->field_0x22d | 1;
          plVar9->state = MT_LOOK_BOUND_IN;
          plVar9->mp = 2;
          pcVar7 = strstr(&local_108,"boundary=");
          if (pcVar7 != (char *)0x0) {
            builtin_strncpy(plVar9->mime_boundary,"\r\n--",4);
            pcVar12 = pcVar7 + 10;
            if (pcVar7[9] != '\"') {
              pcVar12 = pcVar7 + 9;
            }
            lVar10 = 0;
            do {
              bVar1 = pcVar12[lVar10];
              if (((ulong)bVar1 < 0x3c) && ((0x800000500000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
              {
                uVar6 = (int)lVar10 + 4;
                goto LAB_00135199;
              }
              plVar9->mime_boundary[lVar10 + 4] = bVar1;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x7b);
            uVar6 = 0x7f;
LAB_00135199:
            plVar9->mime_boundary[uVar6] = '\0';
          }
        }
        spa->s = plVar9;
        if ((ulong)(uint)i->count_params == 0) {
          return spa;
        }
        sVar13 = (ulong)(uint)i->count_params << 2;
        if (i->ac == (lwsac **)0x0) {
          piVar11 = (int *)lws_zalloc(sVar13,"spa param len");
        }
        else {
          piVar11 = (int *)lwsac_use_zero(i->ac,sVar13,i->ac_chunk_size);
        }
        spa->param_length = piVar11;
        if (piVar11 != (int *)0x0) {
          return spa;
        }
        lws_urldecode_s_destroy(spa,spa->s);
      }
      pplVar14 = i->ac;
      if (pplVar14 != (lwsac **)0x0) goto LAB_00135250;
      lws_realloc(spa->params,0,"lws_free");
    }
    else {
      sVar13 = (ulong)(uint)i->count_params << 3;
      if (i->ac == (lwsac **)0x0) {
        ppcVar8 = (char **)lws_zalloc(sVar13,"spa params");
      }
      else {
        ppcVar8 = (char **)lwsac_use_zero(i->ac,sVar13,i->ac_chunk_size);
      }
      spa->params = ppcVar8;
      if (ppcVar8 != (char **)0x0) {
        pcVar7 = spa->storage;
        iVar5 = i->max_storage;
        goto LAB_0013500d;
      }
    }
    pplVar14 = i->ac;
    if (pplVar14 != (lwsac **)0x0) goto LAB_00135250;
    lws_realloc(spa->storage,0,"lws_free");
  }
  pplVar14 = i->ac;
  if (pplVar14 == (lwsac **)0x0) {
    lws_realloc(spa,0,"lws_free");
    pplVar14 = i->ac;
    if (pplVar14 == (lwsac **)0x0) {
      return (lws_spa *)0x0;
    }
  }
LAB_00135250:
  lwsac_free(pplVar14);
  return (lws_spa *)0x0;
}

Assistant:

struct lws_spa *
lws_spa_create_via_info(struct lws *wsi, const lws_spa_create_info_t *i)
{
	struct lws_spa *spa;

	if (i->ac)
		spa = lwsac_use_zero(i->ac, sizeof(*spa), i->ac_chunk_size);
	else
		spa = lws_zalloc(sizeof(*spa), "spa");

	if (!spa)
		return NULL;

	spa->i = *i;
	if (!spa->i.max_storage)
		spa->i.max_storage = 512;

	if (i->ac)
		spa->storage = lwsac_use(i->ac, (unsigned int)spa->i.max_storage,
					 i->ac_chunk_size);
	else
		spa->storage = lws_malloc((unsigned int)spa->i.max_storage, "spa");

	if (!spa->storage)
		goto bail2;

	spa->end = spa->storage + i->max_storage - 1;

	if (i->count_params) {
		if (i->ac)
			spa->params = lwsac_use_zero(i->ac,
				sizeof(char *) * (unsigned int)i->count_params, i->ac_chunk_size);
		else
			spa->params = lws_zalloc(sizeof(char *) * (unsigned int)i->count_params,
					 "spa params");
		if (!spa->params)
			goto bail3;
	}

	spa->s = lws_urldecode_s_create(spa, wsi, spa->storage, i->max_storage,
					lws_urldecode_spa_cb);
	if (!spa->s)
		goto bail4;

	if (i->count_params) {
		if (i->ac)
			spa->param_length = lwsac_use_zero(i->ac,
				sizeof(int) * (unsigned int)i->count_params, i->ac_chunk_size);
		else
			spa->param_length = lws_zalloc(sizeof(int) * (unsigned int)i->count_params,
						"spa param len");
		if (!spa->param_length)
			goto bail5;
	}

	// lwsl_notice("%s: Created SPA %p\n", __func__, spa);

	return spa;

bail5:
	lws_urldecode_s_destroy(spa, spa->s);
bail4:
	if (!i->ac)
		lws_free(spa->params);
bail3:
	if (!i->ac)
		lws_free(spa->storage);
bail2:
	if (!i->ac)
		lws_free(spa);

	if (i->ac)
		lwsac_free(i->ac);

	return NULL;
}